

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_builder_add_point(PS_Builder *builder,FT_Pos x,FT_Pos y,FT_Byte flag)

{
  short sVar1;
  short sVar2;
  FT_Outline *pFVar3;
  FT_Vector *pFVar4;
  char *pcVar5;
  char cVar6;
  FT_Byte *control;
  FT_Vector *point;
  FT_Outline *outline;
  FT_Byte flag_local;
  FT_Pos y_local;
  FT_Pos x_local;
  PS_Builder *builder_local;
  
  pFVar3 = builder->current;
  if (builder->load_points != '\0') {
    pFVar4 = pFVar3->points;
    sVar1 = pFVar3->n_points;
    pcVar5 = pFVar3->tags;
    sVar2 = pFVar3->n_points;
    pFVar4[(int)sVar1].x = x >> 10;
    pFVar4[(int)sVar1].y = y >> 10;
    cVar6 = '\x02';
    if (flag != '\0') {
      cVar6 = '\x01';
    }
    pcVar5[(int)sVar2] = cVar6;
  }
  pFVar3->n_points = pFVar3->n_points + 1;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_builder_add_point( PS_Builder*  builder,
                        FT_Pos       x,
                        FT_Pos       y,
                        FT_Byte      flag )
  {
    FT_Outline*  outline = builder->current;


    if ( builder->load_points )
    {
      FT_Vector*  point   = outline->points + outline->n_points;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points;

#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      PS_Driver  driver   = (PS_Driver)FT_FACE_DRIVER( builder->face );


      if ( !builder->is_t1 &&
           driver->hinting_engine == FT_HINTING_FREETYPE )
      {
        point->x = x >> 16;
        point->y = y >> 16;
      }
      else
#endif
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
#ifndef CFF_CONFIG_OPTION_OLD_ENGINE
      PS_Driver  driver   = (PS_Driver)FT_FACE_DRIVER( builder->face );
#endif
      if ( builder->is_t1 &&
           driver->hinting_engine == FT_HINTING_FREETYPE )
      {
        point->x = FIXED_TO_INT( x );
        point->y = FIXED_TO_INT( y );
      }
      else
#endif
      {
        /* cf2_decoder_parse_charstrings uses 16.16 coordinates */
        point->x = x >> 10;
        point->y = y >> 10;
      }
      *control = (FT_Byte)( flag ? FT_CURVE_TAG_ON : FT_CURVE_TAG_CUBIC );
    }
    outline->n_points++;
  }